

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

parser_error parse_renderer_units(parser *p)

{
  void *pvVar1;
  void *pvVar2;
  char *src;
  size_t sVar3;
  size_t sVar4;
  parser_error pVar5;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    mem_free(*(void **)((long)pvVar1 + 0x28));
    pvVar2 = mem_alloc(100);
    *(void **)((long)pvVar1 + 0x28) = pvVar2;
    src = parser_getstr(p,"units");
    sVar3 = text_mbstowcs(*(wchar_t **)((long)pvVar1 + 0x28),src,L'\x18');
    pVar5 = PARSE_ERROR_INVALID_VALUE;
    if (sVar3 != 0xffffffffffffffff) {
      sVar4 = text_mbstowcs((wchar_t *)(sVar3 * 4 + *(long *)((long)pvVar1 + 0x28)),"",L'\x01');
      if (sVar4 != 0xffffffffffffffff) {
        *(int *)((long)pvVar1 + 0x54) = (int)sVar3;
        pVar5 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_renderer_units(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *units;
	size_t n, n2;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	mem_free(renderer->units_label);
	renderer->units_label = mem_alloc((MAX_UNITS_LABEL + 1) *
		sizeof(*renderer->units_label));
	units = parser_getstr(p, "units");
	n = text_mbstowcs(renderer->units_label, units, MAX_UNITS_LABEL);
	if (n == (size_t)-1) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	/* Ensure null termination. */
	n2 = text_mbstowcs(renderer->units_label + n, "", 1);
	if (n2 == (size_t)-1) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	renderer->units_nlabel = n;
	return PARSE_ERROR_NONE;
}